

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGenInitializer::InfoWriter::ListJoin<std::_Rb_tree_const_iterator<std::__cxx11::string>>
          (string *__return_storage_ptr__,InfoWriter *this,
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          it_begin,_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   it_end)

{
  bool bVar1;
  char *local_48;
  char *c;
  _Self local_30;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  _Self local_20;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it_end_local;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it_begin_local;
  string *res;
  
  it._M_node._7_1_ = 0;
  local_20._M_node = it_begin._M_node;
  it_end_local._M_node = (_Base_ptr)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30._M_node = it_end_local._M_node;
  while (bVar1 = std::operator!=(&local_30,&local_20), bVar1) {
    bVar1 = std::operator!=(&local_30,&it_end_local);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->(&local_30);
    for (local_48 = (char *)std::__cxx11::string::c_str(); *local_48 != '\0';
        local_48 = local_48 + 1) {
      if (*local_48 == '\"') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
      }
      else if (*local_48 == '$') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\$");
      }
      else if (*local_48 == '\\') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
      }
      else if (*local_48 == ';') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\;");
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_48);
      }
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenInitializer::InfoWriter::ListJoin(IT it_begin,
                                                         IT it_end)
{
  std::string res;
  for (IT it = it_begin; it != it_end; ++it) {
    if (it != it_begin) {
      res += ';';
    }
    for (const char* c = it->c_str(); *c; ++c) {
      if (*c == '"') {
        // Escape the double quote to avoid ending the argument.
        res += "\\\"";
      } else if (*c == '$') {
        // Escape the dollar to avoid expanding variables.
        res += "\\$";
      } else if (*c == '\\') {
        // Escape the backslash to avoid other escapes.
        res += "\\\\";
      } else if (*c == ';') {
        // Escape the semicolon to avoid list expansion.
        res += "\\;";
      } else {
        // Other characters will be parsed correctly.
        res += *c;
      }
    }
  }
  return res;
}